

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTAC.cpp
# Opt level: O3

SourceLoc * __thiscall
MiniScript::Context::GetSourceLoc(SourceLoc *__return_storage_ptr__,Context *this)

{
  long *plVar1;
  long lVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  TACLine *pTVar4;
  StringStorage *pSVar5;
  
  lVar2 = this->lineNum;
  if (((-1 < lVar2) && (pLVar3 = (this->code).ls, pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0)
      ) && (lVar2 < (long)(pLVar3->super_SimpleVector<MiniScript::TACLine>).mQtyItems)) {
    pTVar4 = (pLVar3->super_SimpleVector<MiniScript::TACLine>).mBuf;
    pSVar5 = pTVar4[lVar2].location.context.ss;
    (__return_storage_ptr__->context).isTemp = false;
    (__return_storage_ptr__->context).ss = pSVar5;
    if (pSVar5 != (StringStorage *)0x0) {
      plVar1 = &(pSVar5->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
    }
    __return_storage_ptr__->lineNum = pTVar4[lVar2].location.lineNum;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->context).ss = (StringStorage *)0x0;
  (__return_storage_ptr__->context).isTemp = false;
  __return_storage_ptr__->lineNum = 0;
  return __return_storage_ptr__;
}

Assistant:

SourceLoc Context::GetSourceLoc() {
		if (lineNum < 0 || lineNum >= code.Count()) {
			return SourceLoc();
		}
		return code[lineNum].location;
	}